

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall FirstTag::FirstTag(FirstTag *this)

{
  allocator<char> local_31;
  string_t local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"firstTag",&local_31);
  cfgfile::tag_t<cfgfile::string_trait_t>::tag_t
            (&this->super_tag_t<cfgfile::string_trait_t>,&local_30,false);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_tag_t<cfgfile::string_trait_t>)._vptr_tag_t = (_func_int **)&PTR__FirstTag_00157490;
  this->m_started = false;
  this->m_finished = false;
  this->m_withString = false;
  SecondTag::SecondTag(&this->m_child,&this->super_tag_t<cfgfile::string_trait_t>);
  return;
}

Assistant:

FirstTag()
		:	cfgfile::tag_t<>( "firstTag", false )
		,	m_started( false )
		,	m_finished( false )
		,	m_withString( false )
		,	m_child( *this )
	{
	}